

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

int Abc_NtkFinCheckTypesOk(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= local_24) {
      return 0;
    }
    pObj_00 = Abc_NtkObj(pNtk,local_24);
    if (((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) &&
       (iVar1 = Abc_ObjFinGateType(pObj_00), iVar1 == -100)) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int Abc_NtkFinCheckTypesOk( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj; int i;
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Abc_ObjFinGateType(pObj) == ABC_FIN_NONE )
            return i;
    return 0;
}